

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void getPeerArrays(int MySize,int MyRank,int PeerSize,int **forwardArray,int **reverseArray)

{
  int *piVar1;
  int *__ptr;
  int *__ptr_00;
  int MyRank_00;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  if (MySize < PeerSize) {
    piVar1 = PeerArray(MySize,MyRank,PeerSize);
    *forwardArray = piVar1;
    if (reverseArray != (int **)0x0) {
      piVar1 = (int *)malloc(8);
      *reverseArray = piVar1;
      *piVar1 = **forwardArray;
      piVar1[1] = -1;
    }
  }
  else {
    piVar1 = (int *)malloc(8);
    *forwardArray = piVar1;
    piVar1[1] = -1;
    __ptr = (int *)malloc(4);
    *piVar1 = -1;
    uVar3 = 0;
    if (0 < PeerSize) {
      MyRank_00 = 0;
      do {
        __ptr_00 = PeerArray(PeerSize,MyRank_00,MySize);
        iVar2 = *__ptr_00;
        if (iVar2 != -1) {
          lVar4 = 0;
          do {
            if (iVar2 == MyRank) {
              iVar2 = (int)uVar3;
              __ptr = (int *)realloc(__ptr,(long)iVar2 * 4 + 8);
              __ptr[iVar2] = MyRank_00;
              uVar3 = (ulong)(iVar2 + 1);
              if (lVar4 == 0) {
                *piVar1 = MyRank_00;
              }
            }
            iVar2 = __ptr_00[lVar4 + 1];
            lVar4 = lVar4 + 1;
          } while (iVar2 != -1);
        }
        free(__ptr_00);
        MyRank_00 = MyRank_00 + 1;
      } while (MyRank_00 != PeerSize);
      uVar3 = (ulong)(int)uVar3;
    }
    __ptr[uVar3] = -1;
    if (reverseArray == (int **)0x0) {
      free(__ptr);
      return;
    }
    *reverseArray = __ptr;
  }
  return;
}

Assistant:

extern void getPeerArrays(int MySize, int MyRank, int PeerSize, int **forwardArray,
                          int **reverseArray)
{
    if (MySize < PeerSize)
    {
        /* more of them than me.  I will have at least one entry in my forward
         * array. */
        *forwardArray = PeerArray(MySize, MyRank, PeerSize);
        /* all need to be notified, but I'm only the forward peer to one of them
         * (the first), so send reverse peer entry only to zeroth entry */
        if (reverseArray)
        {
            *reverseArray = malloc(sizeof(int) * 2);
            (*reverseArray)[0] = (*forwardArray)[0];
            (*reverseArray)[1] = -1;
        }
    }
    else
    {
        /* More of me than of them, there may be 0 or 1 entries in my forward
         * array, but there must be one opposing peer that I should notify so
         * that I am in his forward array */
        int *reverse;
        *forwardArray = malloc(sizeof(int) * 2);
        (*forwardArray)[1] = -1;
        reverse = reversePeerArray(MySize, MyRank, PeerSize, &((*forwardArray)[0]));
        if (reverseArray)
        {
            *reverseArray = reverse;
        }
        else
        {
            free(reverse);
        }
    }
}